

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcRobustBufferAccessBehaviorTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::RobustBufferAccessBehavior::StorageBufferTest::iterate(StorageBufferTest *this)

{
  int iVar1;
  deUint32 dVar2;
  uint uVar3;
  undefined4 extraout_var;
  undefined8 uVar5;
  char *description;
  bool bVar6;
  allocator<char> local_19d;
  allocator<char> local_19c;
  allocator<char> local_19b;
  allocator<char> local_19a;
  allocator<char> local_199;
  StorageBufferTest *local_198;
  Buffer destination_buffer;
  Buffer source_buffer;
  Program program;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  long lVar4;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  uVar3 = 1;
  local_198 = this;
  while (this->m_test_case != LAST) {
    destination_buffer.m_context = (this->super_TestCase).m_context;
    destination_buffer.m_id = 0xffffffff;
    source_buffer.m_id = 0xffffffff;
    destination_buffer.m_target = 0x8892;
    program.m_id = 0;
    program.m_compute.m_id = 0;
    program.m_fragment.m_id = 0;
    program.m_geometry.m_id = 0;
    program.m_tess_ctrl.m_id = 0;
    program.m_tess_eval.m_id = 0;
    program.m_vertex.m_id = 0;
    source_buffer.m_target = 0x8892;
    source_buffer.m_context = destination_buffer.m_context;
    program.m_compute.m_context = destination_buffer.m_context;
    program.m_fragment.m_context = destination_buffer.m_context;
    program.m_geometry.m_context = destination_buffer.m_context;
    program.m_tess_ctrl.m_context = destination_buffer.m_context;
    program.m_tess_eval.m_context = destination_buffer.m_context;
    program.m_vertex.m_context = destination_buffer.m_context;
    program.m_context = destination_buffer.m_context;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])(&local_f0,this);
    RobustBufferAccessBehavior::Buffer::InitData
              (&destination_buffer,0x90d2,0x88ea,0x10,iterate::destination_data);
    RobustBufferAccessBehavior::Buffer::InitData
              (&source_buffer,0x90d2,0x88ea,0x10,iterate::source_data);
    RobustBufferAccessBehavior::Buffer::BindBase(&destination_buffer,0);
    RobustBufferAccessBehavior::Buffer::BindBase(&source_buffer,1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,glcts::fixed_sample_locations_values + 1,&local_199);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_19a);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,&local_19b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d0,glcts::fixed_sample_locations_values + 1,&local_19c);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,glcts::fixed_sample_locations_values + 1,&local_19d);
    RobustBufferAccessBehavior::Program::Init
              (&program,&local_f0,&local_90,&local_50,&local_b0,&local_d0,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_90);
    RobustBufferAccessBehavior::Program::Use(&program);
    (**(code **)(lVar4 + 0x528))(1,1,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"DispatchCompute",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd10);
    (**(code **)(lVar4 + 0xdb8))(0xffffffffffffffff);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"MemoryBarrier",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd14);
    RobustBufferAccessBehavior::Buffer::Bind(&destination_buffer);
    uVar5 = (**(code **)(lVar4 + 0xd00))(0x90d2,0,0x10,1);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"MapBufferRange",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd1a);
    uVar3 = (*(local_198->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[6])
                      (local_198,uVar5);
    (**(code **)(lVar4 + 0x1670))(0x90d2);
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"UnmapBuffer",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/common/glcRobustBufferAccessBehaviorTests.cpp"
                    ,0xd1f);
    this = local_198;
    local_198->m_test_case = local_198->m_test_case + SOURCE_INVALID;
    std::__cxx11::string::~string((string *)&local_f0);
    RobustBufferAccessBehavior::Program::~Program(&program);
    RobustBufferAccessBehavior::Buffer::~Buffer(&source_buffer);
    RobustBufferAccessBehavior::Buffer::~Buffer(&destination_buffer);
  }
  bVar6 = (uVar3 & 1) == 0;
  if (bVar6) {
    description = "Fail";
  }
  else {
    description = "Pass";
  }
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,(uint)bVar6,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult StorageBufferTest::iterate()
{
	static const GLfloat destination_data[4] = { 1.0f, 1.0f, 1.0f, 1.0f };
	static const GLfloat source_data[4]		 = { 2.0f, 3.0f, 4.0f, 5.0f };

	/* GL entry points */
	const Functions& gl = m_context.getRenderContext().getFunctions();

	/* Test result indicator */
	bool test_result = true;

	/* Iterate over all cases */
	while (LAST != m_test_case)
	{
		/* Test case objects */
		Buffer  destination_buffer(m_context);
		Buffer  source_buffer(m_context);
		Program program(m_context);

		/* Compute Shader */
		const std::string& cs = getComputeShader();

		/* Buffers initialization */
		destination_buffer.InitData(GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(destination_data),
									destination_data);
		source_buffer.InitData(GL_SHADER_STORAGE_BUFFER, GL_DYNAMIC_COPY, sizeof(source_data), source_data);

		destination_buffer.BindBase(0);
		source_buffer.BindBase(1);

		/* Shaders initialization */
		program.Init(cs, "" /* fs */, "" /* gs */, "" /* tcs */, "" /* tes */, "" /* vs */);
		program.Use();

		/* Dispatch compute */
		gl.dispatchCompute(1 /* x */, 1 /* y */, 1 /* z */);
		GLU_EXPECT_NO_ERROR(gl.getError(), "DispatchCompute");

		/* Set memory barrier */
		gl.memoryBarrier(GL_ALL_BARRIER_BITS);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MemoryBarrier");

		/* Verify results */
		destination_buffer.Bind();
		GLfloat* buffer_data =
			(GLfloat*)gl.mapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, sizeof(destination_data), GL_MAP_READ_BIT);
		GLU_EXPECT_NO_ERROR(gl.getError(), "MapBufferRange");

		test_result = verifyResults(buffer_data);

		gl.unmapBuffer(GL_SHADER_STORAGE_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "UnmapBuffer");

		/* Increment */
		m_test_case = (VERSION)((GLuint)m_test_case + 1);
	}

	/* Set result */
	if (true == test_result)
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		m_context.getTestContext().setTestResult(QP_TEST_RESULT_FAIL, "Fail");
	}

	/* Done */
	return tcu::TestNode::STOP;
}